

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.cpp
# Opt level: O3

void __thiscall
qclab::qgates::CZ<std::complex<double>_>::apply
          (CZ<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int iVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_8_1_703dd281_conflict2 f;
  int *local_48 [2];
  long local_38;
  anon_class_8_1_703dd281_conflict2 local_30;
  
  (*(this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject[5])(local_48,this);
  *(ulong *)local_48[0] =
       CONCAT44(offset + (int)((ulong)*(undefined8 *)local_48[0] >> 0x20),
                offset + (int)*(undefined8 *)local_48[0]);
  iVar1 = (this->super_QControlledGate2<std::complex<double>_>).control_;
  iVar2 = (*(this->super_QControlledGate2<std::complex<double>_>).
            super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xf])(this);
  local_30.vector = *(complex<double> **)vector;
  apply4b<qclab::qgates::lambda_PauliZ<std::complex<double>>(qclab::Op,std::complex<double>*)::_lambda(unsigned_long)_1_>
            (nbQubits,*local_48[0],local_48[0][1],iVar1 + offset,iVar2 + offset,
             (this->super_QControlledGate2<std::complex<double>_>).controlState_,&local_30);
  if (local_48[0] != (int *)0x0) {
    operator_delete(local_48[0],local_38 - (long)local_48[0]);
  }
  return;
}

Assistant:

void CZ< T >::apply( Op op , const int nbQubits , std::vector< T >& vector ,
                       const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    auto f = lambda_PauliZ( op , vector.data() ) ;
    apply4b( nbQubits , qubits[0] , qubits[1] , control , target ,
             this->controlState() , f ) ;
  }